

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregatevulnerabilitytobin.cpp
# Opt level: O2

void doit(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  AggregateVulnerability av;
  char line [4096];
  
  fgets(line,0x1000,_stdin);
  uVar3 = 2;
  while( true ) {
    pcVar2 = fgets(line,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(line,"%d,%d",&av,&av.vulnerability_id);
    if (iVar1 != 2) break;
    fwrite(&av,8,1,_stdout);
    uVar3 = uVar3 + 1;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)uVar3,line);
  exit(1);
}

Assistant:

void doit() {

  char line[4096];
  fgets(line, sizeof(line), stdin);   // Read header
  int lineno = 2;
  AggregateVulnerability av;

  while (fgets(line, sizeof(line), stdin) != 0) {

    if (sscanf(line, "%d,%d", &av.aggregatevulnerability_id,
			      &av.vulnerability_id) != 2) {
      fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
      exit(EXIT_FAILURE);
    }
    
    fwrite(&av, sizeof(av), 1, stdout);
    ++lineno;

  }

}